

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_bind(runtime_type *this,token_base *a,var *b)

{
  proxy *ppVar1;
  bool bVar2;
  int iVar3;
  type_info *this_00;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_01;
  size_type sVar4;
  size_type sVar5;
  var *pvVar6;
  reference ptVar7;
  token_base **pptVar8;
  runtime_error *prVar9;
  any *in_RCX;
  var *__n;
  runtime_type *this_02;
  iterator *this_03;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  *this_04;
  allocator local_91;
  token_base *local_90;
  string local_88;
  any *local_68;
  runtime_type *local_60;
  token_base *local_58;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_50;
  undefined1 local_48 [16];
  
  local_90 = a;
  this_00 = cs_impl::any::type(in_RCX);
  bVar2 = std::type_info::operator!=
                    (this_00,(type_info *)
                             &std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  if (bVar2) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_88,"Only support structured binding with array.",&local_91);
    runtime_error::runtime_error(prVar9,&local_88);
    __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_68 = in_RCX;
  local_60 = this;
  this_01 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(in_RCX);
  local_50 = (deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)(b + 2);
  sVar4 = std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  *)(b + 2));
  sVar5 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_01);
  if (sVar4 == sVar5) {
    this_04 = (_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
               *)(b + 4);
    this_03 = &(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start;
    __n = (var *)0x0;
    while( true ) {
      pvVar6 = (var *)std::
                      deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                      ::size(local_50);
      if (pvVar6 <= __n) break;
      ptVar7 = std::
               _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
               ::operator[](this_04,(difference_type)__n);
      local_88._M_dataplus._M_p = (pointer)ptVar7->mRoot;
      pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
      iVar3 = (*(*pptVar8)->_vptr_token_base[2])();
      if (iVar3 == 0xf) {
        ptVar7 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator[](this_04,(difference_type)__n);
        local_88._M_dataplus._M_p = (pointer)ptVar7->mRoot;
        pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_88);
        local_58 = *pptVar8;
        std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator[]
                  (this_03,(difference_type)__n);
        parse_bind((runtime_type *)&stack0xffffffffffffffc8,local_90,(var *)local_58);
        this_02 = (runtime_type *)&stack0xffffffffffffffc8;
      }
      else {
        ptVar7 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator[](this_04,(difference_type)__n);
        local_88._M_dataplus._M_p = (pointer)ptVar7->mRoot;
        parse_expr((runtime_type *)local_48,(iterator *)local_90,SUB81(&local_88,0));
        pvVar6 = __n;
        std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator[]
                  (this_03,(difference_type)__n);
        parse_asi((runtime_type *)(local_48 + 8),pvVar6,(var *)local_48);
        cs_impl::any::recycle((any *)(local_48 + 8));
        this_02 = (runtime_type *)local_48;
      }
      cs_impl::any::recycle((any *)this_02);
      __n = (var *)((long)&__n->mDat + 1);
    }
    ppVar1 = local_68->mDat;
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->refcount = ppVar1->refcount + 1;
    }
    (local_60->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar1->is_rvalue;
    return (var)(proxy *)local_60;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_88,"Unmatched structured binding.",&local_91);
  runtime_error::runtime_error(prVar9,&local_88);
  __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_bind(token_base *a, const var &b)
	{
		if (b.type() != typeid(array))
			throw runtime_error("Only support structured binding with array.");
		auto &pl = static_cast<token_parallel *>(a)->get_parallel();
		auto &arr = b.const_val<array>();
		if (pl.size() != arr.size())
			throw runtime_error("Unmatched structured binding.");
		for (std::size_t i = 0; i < pl.size(); ++i) {
			if (pl[i].root().data()->get_type() == token_types::parallel)
				parse_bind(pl[i].root().data(), arr[i]);
			else
				parse_asi(parse_expr(pl[i].root()), arr[i]);
		}
		return b;
	}